

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::updateStats(ClaspFacade *this)

{
  uint32 uVar1;
  long lVar2;
  Statistics *pSVar3;
  Summary *pSVar4;
  long in_RDI;
  Statistics *in_stack_ffffffffffffffc0;
  double dVar5;
  
  pSVar3 = SingleOwnerPtr<Clasp::ClaspFacade::Statistics,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Clasp::ClaspFacade::Statistics,_Clasp::DeleteObject> *)
                      0x12525f);
  if (pSVar3 != (Statistics *)0x0) {
    SingleOwnerPtr<Clasp::ClaspFacade::Statistics,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Clasp::ClaspFacade::Statistics,_Clasp::DeleteObject> *)0x125276);
    Statistics::end(in_stack_ffffffffffffffc0);
  }
  pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)0x12528f);
  if (pSVar4 != (Summary *)0x0) {
    pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)0x1252aa
                       );
    if (pSVar4->step != *(uint32 *)(in_RDI + 0x168)) {
      dVar5 = *(double *)(in_RDI + 0x130);
      pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)
                          0x1252dd);
      pSVar4->totalTime = dVar5 + pSVar4->totalTime;
      dVar5 = *(double *)(in_RDI + 0x138);
      pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)
                          0x12530c);
      pSVar4->cpuTime = dVar5 + pSVar4->cpuTime;
      dVar5 = *(double *)(in_RDI + 0x140);
      pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)
                          0x12533b);
      pSVar4->solveTime = dVar5 + pSVar4->solveTime;
      dVar5 = *(double *)(in_RDI + 0x148);
      pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)
                          0x12536a);
      pSVar4->unsatTime = dVar5 + pSVar4->unsatTime;
      dVar5 = *(double *)(in_RDI + 0x150);
      pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)
                          0x125399);
      pSVar4->satTime = dVar5 + pSVar4->satTime;
      lVar2 = *(long *)(in_RDI + 0x158);
      pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)
                          0x1253c6);
      pSVar4->numEnum = lVar2 + pSVar4->numEnum;
      lVar2 = *(long *)(in_RDI + 0x160);
      pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)
                          0x1253f0);
      pSVar4->numOptimal = lVar2 + pSVar4->numOptimal;
      uVar1 = *(uint32 *)(in_RDI + 0x168);
      pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)
                          0x125418);
      pSVar4->step = uVar1;
      pSVar4 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)
                          0x125430);
      pSVar4->result = *(Result *)(in_RDI + 0x16c);
    }
  }
  return;
}

Assistant:

void ClaspFacade::updateStats() {
	if (stats_.get()) {
		stats_->end();
	}
	if (accu_.get() && accu_->step != step_.step) {
		accu_->totalTime  += step_.totalTime;
		accu_->cpuTime    += step_.cpuTime;
		accu_->solveTime  += step_.solveTime;
		accu_->unsatTime  += step_.unsatTime;
		accu_->satTime    += step_.satTime;
		accu_->numEnum    += step_.numEnum;
		accu_->numOptimal += step_.numOptimal;
		// no aggregation
		accu_->step   = step_.step;
		accu_->result = step_.result;
	}
}